

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoolAllocator.h
# Opt level: O3

BranchNode<unsigned_long,_8U,_false> * __thiscall
slang::PoolAllocator<char,192ul,64ul>::
emplace<slang::IntervalMapDetails::BranchNode<unsigned_long,8u,false>>
          (PoolAllocator<char,192ul,64ul> *this)

{
  BumpAllocator *this_00;
  BranchNode<unsigned_long,_8U,_false> *pBVar1;
  byte *__s;
  
  __s = *(byte **)(this + 8);
  if (__s == (byte *)0x0) {
    this_00 = *(BumpAllocator **)this;
    __s = (byte *)((ulong)(this_00->head->current + 0x3f) & 0xffffffffffffffc0);
    if (this_00->endPtr < __s + 0xc0) {
      __s = BumpAllocator::allocateSlow(this_00,0xc0,0x40);
    }
    else {
      this_00->head->current = __s + 0xc0;
    }
  }
  else {
    *(undefined8 *)(this + 8) = *(undefined8 *)__s;
  }
  pBVar1 = (BranchNode<unsigned_long,_8U,_false> *)memset(__s,0,0xc0);
  return pBVar1;
}

Assistant:

TSubClass* emplace(Args&&... args) {
        static_assert(sizeof(TSubClass) <= Size);
        static_assert(alignof(TSubClass) <= Align);
        static_assert(std::is_trivially_destructible_v<TSubClass>);
        auto mem = freeList ? reinterpret_cast<TSubClass*>(pop())
                            : reinterpret_cast<TSubClass*>(alloc.allocate(Size, Align));
        return new (mem) TSubClass(std::forward<Args>(args)...);
    }